

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_stdcxx.h
# Opt level: O0

bool leveldb::port::Snappy_GetUncompressedLength(char *input,size_t length,size_t *result)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

inline bool Snappy_GetUncompressedLength(const char* input, size_t length,
                                         size_t* result) {
#if HAVE_SNAPPY
  return snappy::GetUncompressedLength(input, length, result);
#else
  // Silence compiler warnings about unused arguments.
  (void)input;
  (void)length;
  (void)result;
  return false;
#endif  // HAVE_SNAPPY
}